

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=(string<unsigned_short> *this,unsigned_short *c)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  puVar1 = this->array;
  if (c == (unsigned_short *)0x0) {
    if (puVar1 == (unsigned_short *)0x0) {
      puVar1 = (unsigned_short *)operator_new__(2);
      this->array = puVar1;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar1 = 0;
  }
  else if (puVar1 != c) {
    if (*c == 0) {
      uVar5 = 1;
    }
    else {
      uVar5 = 1;
      do {
        puVar2 = c + uVar5;
        uVar5 = uVar5 + 1;
      } while (*puVar2 != 0);
    }
    iVar4 = (int)uVar5;
    this->used = iVar4;
    this->allocated = iVar4;
    puVar2 = (unsigned_short *)operator_new__((ulong)(uint)(iVar4 * 2));
    this->array = puVar2;
    uVar3 = 0;
    do {
      this->array[uVar3] = c[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar5 & 0xffffffff) != uVar3);
    if (puVar1 != (unsigned_short *)0x0) {
      operator_delete__(puVar1);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}